

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memalign_unittest.cc
# Opt level: O3

void __thiscall MemalignTest_Basic_Test::TestBody(MemalignTest_Basic_Test *this)

{
  uint uVar1;
  char *pcVar2;
  undefined1 auVar3 [16];
  char *pcVar4;
  char *__ptr;
  char *__ptr_00;
  long lVar5;
  void *__ptr_01;
  ulong uVar6;
  undefined8 extraout_RAX;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  undefined8 uVar10;
  uchar *buffer_3;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var11;
  ulong uVar12;
  uchar *buffer_4;
  size_t __size;
  uint uVar13;
  bool bVar14;
  bool bVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  char cVar20;
  char cVar24;
  char cVar25;
  char cVar26;
  char cVar27;
  char cVar28;
  char cVar29;
  char cVar30;
  char cVar31;
  char cVar32;
  char cVar33;
  char cVar34;
  char cVar35;
  char cVar36;
  char cVar37;
  undefined1 auVar21 [16];
  char cVar38;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  int iVar70;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  int iVar151;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  int iVar152;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  int iVar153;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  int iVar154;
  int iVar170;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  int iVar171;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 in_XMM13 [16];
  undefined1 auVar172 [16];
  undefined1 in_XMM14 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  AssertHelper local_58;
  code *local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_40;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_38;
  void *ptr;
  
  uVar13 = 1;
  do {
    uVar6 = (ulong)uVar13;
    uVar7 = 0;
    do {
      uVar12 = (ulong)(int)uVar7;
      local_38._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           memalign(uVar6,uVar12);
      local_40._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           Misallignment(local_38._M_head_impl,uVar6);
      local_58.data_._0_4_ = 0;
      testing::internal::CmpHelperEQ<unsigned_long,int>
                ((internal *)&local_50,"Misallignment(ptr, a)","0",(unsigned_long *)&local_40,
                 (int *)&local_58);
      if (local_50._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)&local_40);
        if (local_48 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = (local_48->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_58,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/memalign_unittest.cc"
                   ,0x84,pcVar4);
        testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_40);
LAB_0010a5e0:
        testing::internal::AssertHelper::~AssertHelper(&local_58);
        _Var11._M_head_impl = local_40._M_head_impl;
        goto LAB_0010a5ed;
      }
      if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_48,local_48);
      }
      auVar3 = _DAT_00139090;
      if (0 < (int)uVar7) {
        lVar5 = uVar12 - 1;
        auVar16._8_4_ = (int)lVar5;
        auVar16._0_8_ = lVar5;
        auVar16._12_4_ = (int)((ulong)lVar5 >> 0x20);
        uVar8 = 0;
        auVar66 = _DAT_00139080;
        auVar82 = _DAT_00139070;
        auVar177 = _DAT_00139060;
        auVar128 = _DAT_00139050;
        auVar48 = _DAT_00139040;
        auVar52 = _DAT_00139030;
        auVar56 = _DAT_00139020;
        auVar60 = _DAT_00139010;
        do {
          auVar64 = auVar16 ^ auVar3;
          auVar71 = auVar66 ^ auVar3;
          iVar151 = auVar64._0_4_;
          iVar154 = -(uint)(iVar151 < auVar71._0_4_);
          iVar152 = auVar64._4_4_;
          auVar72._4_4_ = -(uint)(iVar152 < auVar71._4_4_);
          iVar153 = auVar64._8_4_;
          iVar170 = -(uint)(iVar153 < auVar71._8_4_);
          iVar70 = auVar64._12_4_;
          auVar72._12_4_ = -(uint)(iVar70 < auVar71._12_4_);
          auVar119._4_4_ = iVar154;
          auVar119._0_4_ = iVar154;
          auVar119._8_4_ = iVar170;
          auVar119._12_4_ = iVar170;
          auVar172 = pshuflw(in_XMM13,auVar119,0xe8);
          auVar64._4_4_ = -(uint)(auVar71._4_4_ == iVar152);
          auVar64._12_4_ = -(uint)(auVar71._12_4_ == iVar70);
          auVar64._0_4_ = auVar64._4_4_;
          auVar64._8_4_ = auVar64._12_4_;
          auVar173 = pshuflw(in_XMM14,auVar64,0xe8);
          auVar72._0_4_ = auVar72._4_4_;
          auVar72._8_4_ = auVar72._12_4_;
          auVar71 = pshuflw(auVar172,auVar72,0xe8);
          auVar174._8_4_ = 0xffffffff;
          auVar174._0_8_ = 0xffffffffffffffff;
          auVar174._12_4_ = 0xffffffff;
          auVar71 = (auVar71 | auVar173 & auVar172) ^ auVar174;
          auVar71 = packssdw(auVar71,auVar71);
          cVar20 = (char)uVar8;
          if ((auVar71 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            local_38._M_head_impl[uVar8] =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
                 (cVar20 + 'x');
          }
          auVar72 = auVar64 & auVar119 | auVar72;
          auVar64 = packssdw(auVar72,auVar72);
          auVar64 = packssdw(auVar64 ^ auVar174,auVar64 ^ auVar174);
          auVar64 = packsswb(auVar64,auVar64);
          if ((auVar64._0_4_ >> 8 & 1) != 0) {
            local_38._M_head_impl[uVar8 + 1] =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
                 (cVar20 + 'y');
          }
          auVar64 = auVar82 ^ auVar3;
          iVar154 = -(uint)(iVar151 < auVar64._0_4_);
          auVar173._4_4_ = -(uint)(iVar152 < auVar64._4_4_);
          iVar170 = -(uint)(iVar153 < auVar64._8_4_);
          auVar173._12_4_ = -(uint)(iVar70 < auVar64._12_4_);
          auVar71._4_4_ = iVar154;
          auVar71._0_4_ = iVar154;
          auVar71._8_4_ = iVar170;
          auVar71._12_4_ = iVar170;
          auVar172._4_4_ = -(uint)(auVar64._4_4_ == iVar152);
          auVar172._12_4_ = -(uint)(auVar64._12_4_ == iVar70);
          auVar172._0_4_ = auVar172._4_4_;
          auVar172._8_4_ = auVar172._12_4_;
          auVar173._0_4_ = auVar173._4_4_;
          auVar173._8_4_ = auVar173._12_4_;
          auVar64 = auVar172 & auVar71 | auVar173;
          auVar64 = packssdw(auVar64,auVar64);
          auVar64 = packssdw(auVar64 ^ auVar174,auVar64 ^ auVar174);
          auVar64 = packsswb(auVar64,auVar64);
          if ((auVar64._0_4_ >> 0x10 & 1) != 0) {
            local_38._M_head_impl[uVar8 + 2] =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
                 (cVar20 + 'z');
          }
          auVar71 = pshufhw(auVar71,auVar71,0x84);
          auVar119 = pshufhw(auVar172,auVar172,0x84);
          auVar72 = pshufhw(auVar71,auVar173,0x84);
          auVar71 = (auVar72 | auVar119 & auVar71) ^ auVar174;
          auVar71 = packssdw(auVar71,auVar71);
          auVar71 = packsswb(auVar71,auVar71);
          if ((auVar71._0_4_ >> 0x18 & 1) != 0) {
            local_38._M_head_impl[uVar8 + 3] =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
                 (cVar20 + '{');
          }
          auVar71 = auVar177 ^ auVar3;
          iVar154 = -(uint)(iVar151 < auVar71._0_4_);
          auVar74._4_4_ = -(uint)(iVar152 < auVar71._4_4_);
          iVar170 = -(uint)(iVar153 < auVar71._8_4_);
          auVar74._12_4_ = -(uint)(iVar70 < auVar71._12_4_);
          auVar120._4_4_ = iVar154;
          auVar120._0_4_ = iVar154;
          auVar120._8_4_ = iVar170;
          auVar120._12_4_ = iVar170;
          auVar64 = pshuflw(auVar64,auVar120,0xe8);
          auVar73._4_4_ = -(uint)(auVar71._4_4_ == iVar152);
          auVar73._12_4_ = -(uint)(auVar71._12_4_ == iVar70);
          auVar73._0_4_ = auVar73._4_4_;
          auVar73._8_4_ = auVar73._12_4_;
          auVar72 = pshuflw(auVar174,auVar73,0xe8);
          auVar74._0_4_ = auVar74._4_4_;
          auVar74._8_4_ = auVar74._12_4_;
          auVar71 = pshuflw(auVar64,auVar74,0xe8);
          auVar175._8_4_ = 0xffffffff;
          auVar175._0_8_ = 0xffffffffffffffff;
          auVar175._12_4_ = 0xffffffff;
          auVar64 = (auVar71 | auVar72 & auVar64) ^ auVar175;
          auVar64 = packssdw(auVar64,auVar64);
          auVar64 = packsswb(auVar64,auVar64);
          if ((auVar64 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            local_38._M_head_impl[uVar8 + 4] =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
                 (cVar20 + '|');
          }
          auVar74 = auVar73 & auVar120 | auVar74;
          auVar64 = packssdw(auVar74,auVar74);
          auVar64 = packssdw(auVar64 ^ auVar175,auVar64 ^ auVar175);
          auVar64 = packsswb(auVar64,auVar64);
          if ((auVar64._4_2_ >> 8 & 1) != 0) {
            local_38._M_head_impl[uVar8 + 5] =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
                 (cVar20 + '}');
          }
          auVar64 = auVar128 ^ auVar3;
          iVar154 = -(uint)(iVar151 < auVar64._0_4_);
          auVar155._4_4_ = -(uint)(iVar152 < auVar64._4_4_);
          iVar170 = -(uint)(iVar153 < auVar64._8_4_);
          auVar155._12_4_ = -(uint)(iVar70 < auVar64._12_4_);
          auVar75._4_4_ = iVar154;
          auVar75._0_4_ = iVar154;
          auVar75._8_4_ = iVar170;
          auVar75._12_4_ = iVar170;
          auVar121._4_4_ = -(uint)(auVar64._4_4_ == iVar152);
          auVar121._12_4_ = -(uint)(auVar64._12_4_ == iVar70);
          auVar121._0_4_ = auVar121._4_4_;
          auVar121._8_4_ = auVar121._12_4_;
          auVar155._0_4_ = auVar155._4_4_;
          auVar155._8_4_ = auVar155._12_4_;
          auVar64 = auVar121 & auVar75 | auVar155;
          auVar64 = packssdw(auVar64,auVar64);
          auVar64 = packssdw(auVar64 ^ auVar175,auVar64 ^ auVar175);
          auVar64 = packsswb(auVar64,auVar64);
          if ((auVar64 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            local_38._M_head_impl[uVar8 + 6] =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
                 (cVar20 + '~');
          }
          auVar71 = pshufhw(auVar75,auVar75,0x84);
          auVar119 = pshufhw(auVar121,auVar121,0x84);
          auVar72 = pshufhw(auVar71,auVar155,0x84);
          auVar71 = (auVar72 | auVar119 & auVar71) ^ auVar175;
          auVar71 = packssdw(auVar71,auVar71);
          auVar71 = packsswb(auVar71,auVar71);
          if ((auVar71._6_2_ >> 8 & 1) != 0) {
            local_38._M_head_impl[uVar8 + 7] =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
                 (cVar20 + '\x7f');
          }
          auVar71 = auVar48 ^ auVar3;
          iVar154 = -(uint)(iVar151 < auVar71._0_4_);
          auVar77._4_4_ = -(uint)(iVar152 < auVar71._4_4_);
          iVar170 = -(uint)(iVar153 < auVar71._8_4_);
          auVar77._12_4_ = -(uint)(iVar70 < auVar71._12_4_);
          auVar122._4_4_ = iVar154;
          auVar122._0_4_ = iVar154;
          auVar122._8_4_ = iVar170;
          auVar122._12_4_ = iVar170;
          auVar64 = pshuflw(auVar64,auVar122,0xe8);
          auVar76._4_4_ = -(uint)(auVar71._4_4_ == iVar152);
          auVar76._12_4_ = -(uint)(auVar71._12_4_ == iVar70);
          auVar76._0_4_ = auVar76._4_4_;
          auVar76._8_4_ = auVar76._12_4_;
          auVar72 = pshuflw(auVar175,auVar76,0xe8);
          auVar77._0_4_ = auVar77._4_4_;
          auVar77._8_4_ = auVar77._12_4_;
          auVar71 = pshuflw(auVar64,auVar77,0xe8);
          auVar176._8_4_ = 0xffffffff;
          auVar176._0_8_ = 0xffffffffffffffff;
          auVar176._12_4_ = 0xffffffff;
          auVar64 = (auVar71 | auVar72 & auVar64) ^ auVar176;
          auVar64 = packssdw(auVar64,auVar64);
          auVar64 = packsswb(auVar64,auVar64);
          if ((auVar64 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            local_38._M_head_impl[uVar8 + 8] =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
                 (cVar20 + -0x80);
          }
          auVar77 = auVar76 & auVar122 | auVar77;
          auVar64 = packssdw(auVar77,auVar77);
          auVar64 = packssdw(auVar64 ^ auVar176,auVar64 ^ auVar176);
          auVar64 = packsswb(auVar64,auVar64);
          if ((auVar64._8_2_ >> 8 & 1) != 0) {
            local_38._M_head_impl[uVar8 + 9] =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
                 (cVar20 + -0x7f);
          }
          auVar64 = auVar52 ^ auVar3;
          iVar154 = -(uint)(iVar151 < auVar64._0_4_);
          auVar156._4_4_ = -(uint)(iVar152 < auVar64._4_4_);
          iVar170 = -(uint)(iVar153 < auVar64._8_4_);
          auVar156._12_4_ = -(uint)(iVar70 < auVar64._12_4_);
          auVar78._4_4_ = iVar154;
          auVar78._0_4_ = iVar154;
          auVar78._8_4_ = iVar170;
          auVar78._12_4_ = iVar170;
          auVar123._4_4_ = -(uint)(auVar64._4_4_ == iVar152);
          auVar123._12_4_ = -(uint)(auVar64._12_4_ == iVar70);
          auVar123._0_4_ = auVar123._4_4_;
          auVar123._8_4_ = auVar123._12_4_;
          auVar156._0_4_ = auVar156._4_4_;
          auVar156._8_4_ = auVar156._12_4_;
          auVar64 = auVar123 & auVar78 | auVar156;
          auVar64 = packssdw(auVar64,auVar64);
          auVar64 = packssdw(auVar64 ^ auVar176,auVar64 ^ auVar176);
          auVar64 = packsswb(auVar64,auVar64);
          if ((auVar64 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            local_38._M_head_impl[uVar8 + 10] =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
                 (cVar20 + -0x7e);
          }
          auVar71 = pshufhw(auVar78,auVar78,0x84);
          auVar119 = pshufhw(auVar123,auVar123,0x84);
          auVar72 = pshufhw(auVar71,auVar156,0x84);
          auVar71 = (auVar72 | auVar119 & auVar71) ^ auVar176;
          auVar71 = packssdw(auVar71,auVar71);
          auVar71 = packsswb(auVar71,auVar71);
          if ((auVar71._10_2_ >> 8 & 1) != 0) {
            local_38._M_head_impl[uVar8 + 0xb] =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
                 (cVar20 + -0x7d);
          }
          auVar71 = auVar56 ^ auVar3;
          iVar154 = -(uint)(iVar151 < auVar71._0_4_);
          auVar80._4_4_ = -(uint)(iVar152 < auVar71._4_4_);
          iVar170 = -(uint)(iVar153 < auVar71._8_4_);
          auVar80._12_4_ = -(uint)(iVar70 < auVar71._12_4_);
          auVar124._4_4_ = iVar154;
          auVar124._0_4_ = iVar154;
          auVar124._8_4_ = iVar170;
          auVar124._12_4_ = iVar170;
          auVar64 = pshuflw(auVar64,auVar124,0xe8);
          auVar79._4_4_ = -(uint)(auVar71._4_4_ == iVar152);
          auVar79._12_4_ = -(uint)(auVar71._12_4_ == iVar70);
          auVar79._0_4_ = auVar79._4_4_;
          auVar79._8_4_ = auVar79._12_4_;
          auVar72 = pshuflw(auVar176,auVar79,0xe8);
          auVar80._0_4_ = auVar80._4_4_;
          auVar80._8_4_ = auVar80._12_4_;
          auVar71 = pshuflw(auVar64,auVar80,0xe8);
          in_XMM14._8_4_ = 0xffffffff;
          in_XMM14._0_8_ = 0xffffffffffffffff;
          in_XMM14._12_4_ = 0xffffffff;
          auVar64 = (auVar71 | auVar72 & auVar64) ^ in_XMM14;
          auVar64 = packssdw(auVar64,auVar64);
          auVar64 = packsswb(auVar64,auVar64);
          if ((auVar64 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            local_38._M_head_impl[uVar8 + 0xc] =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
                 (cVar20 + -0x7c);
          }
          auVar80 = auVar79 & auVar124 | auVar80;
          auVar64 = packssdw(auVar80,auVar80);
          auVar64 = packssdw(auVar64 ^ in_XMM14,auVar64 ^ in_XMM14);
          auVar64 = packsswb(auVar64,auVar64);
          if ((auVar64._12_2_ >> 8 & 1) != 0) {
            local_38._M_head_impl[uVar8 + 0xd] =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
                 (cVar20 + -0x7b);
          }
          auVar64 = auVar60 ^ auVar3;
          auVar157._0_4_ = -(uint)(iVar151 < auVar64._0_4_);
          auVar157._4_4_ = -(uint)(iVar152 < auVar64._4_4_);
          auVar157._8_4_ = -(uint)(iVar153 < auVar64._8_4_);
          auVar157._12_4_ = -(uint)(iVar70 < auVar64._12_4_);
          auVar81._4_4_ = auVar157._0_4_;
          auVar81._0_4_ = auVar157._0_4_;
          auVar81._8_4_ = auVar157._8_4_;
          auVar81._12_4_ = auVar157._8_4_;
          iVar151 = -(uint)(auVar64._4_4_ == iVar152);
          iVar152 = -(uint)(auVar64._12_4_ == iVar70);
          auVar65._4_4_ = iVar151;
          auVar65._0_4_ = iVar151;
          auVar65._8_4_ = iVar152;
          auVar65._12_4_ = iVar152;
          auVar125._4_4_ = auVar157._4_4_;
          auVar125._0_4_ = auVar157._4_4_;
          auVar125._8_4_ = auVar157._12_4_;
          auVar125._12_4_ = auVar157._12_4_;
          in_XMM13 = auVar65 & auVar81 | auVar125;
          auVar64 = packssdw(auVar157,in_XMM13);
          auVar64 = packssdw(auVar64 ^ in_XMM14,auVar64 ^ in_XMM14);
          auVar64 = packsswb(auVar64,auVar64);
          if ((auVar64 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            local_38._M_head_impl[uVar8 + 0xe] =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
                 (cVar20 + -0x7a);
          }
          auVar71 = pshufhw(auVar81,auVar81,0x84);
          auVar64 = pshufhw(auVar65,auVar65,0x84);
          auVar72 = pshufhw(auVar71,auVar125,0x84);
          auVar64 = packssdw(auVar64 & auVar71,(auVar72 | auVar64 & auVar71) ^ in_XMM14);
          auVar64 = packsswb(auVar64,auVar64);
          if ((auVar64._14_2_ >> 8 & 1) != 0) {
            local_38._M_head_impl[uVar8 + 0xf] =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
                 (cVar20 + -0x79);
          }
          uVar8 = uVar8 + 0x10;
          lVar5 = auVar66._8_8_;
          auVar66._0_8_ = auVar66._0_8_ + 0x10;
          auVar66._8_8_ = lVar5 + 0x10;
          lVar5 = auVar82._8_8_;
          auVar82._0_8_ = auVar82._0_8_ + 0x10;
          auVar82._8_8_ = lVar5 + 0x10;
          lVar5 = auVar177._8_8_;
          auVar177._0_8_ = auVar177._0_8_ + 0x10;
          auVar177._8_8_ = lVar5 + 0x10;
          lVar5 = auVar128._8_8_;
          auVar128._0_8_ = auVar128._0_8_ + 0x10;
          auVar128._8_8_ = lVar5 + 0x10;
          lVar5 = auVar48._8_8_;
          auVar48._0_8_ = auVar48._0_8_ + 0x10;
          auVar48._8_8_ = lVar5 + 0x10;
          lVar5 = auVar52._8_8_;
          auVar52._0_8_ = auVar52._0_8_ + 0x10;
          auVar52._8_8_ = lVar5 + 0x10;
          lVar5 = auVar56._8_8_;
          auVar56._0_8_ = auVar56._0_8_ + 0x10;
          auVar56._8_8_ = lVar5 + 0x10;
          lVar5 = auVar60._8_8_;
          auVar60._0_8_ = auVar60._0_8_ + 0x10;
          auVar60._8_8_ = lVar5 + 0x10;
        } while ((uVar7 + 0xf & 0xfffffff0) != uVar8);
        if (*local_38._M_head_impl ==
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)0x78) {
          uVar8 = 1;
          do {
            uVar9 = uVar8;
            if (uVar12 == uVar9) break;
            uVar8 = uVar9 + 1;
          } while ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
                   ((char)(uVar9 + 1) + 'w') == local_38._M_head_impl[uVar9]);
          if (uVar12 <= uVar9) goto LAB_00108e00;
        }
        pcVar4 = "Check failed: Valid(ptr, s, \'x\')\n";
LAB_0010a7b5:
        uVar10 = 0x21;
        goto LAB_0010a7bf;
      }
LAB_00108e00:
      free(local_38._M_head_impl);
      if (7 < uVar13) {
        iVar151 = posix_memalign(&local_38._M_head_impl,uVar6,uVar12);
        if (iVar151 != 0) {
          pcVar4 = "Check failed: posix_memalign(&ptr, a, s) == 0\n";
          uVar10 = 0x2e;
          goto LAB_0010a7bf;
        }
        local_40._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             Misallignment(local_38._M_head_impl,uVar6);
        local_58.data_._0_4_ = 0;
        testing::internal::CmpHelperEQ<unsigned_long,int>
                  ((internal *)&local_50,"Misallignment(ptr, a)","0",(unsigned_long *)&local_40,
                   (int *)&local_58);
        if (local_50._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)&local_40);
          if (local_48 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar4 = "";
          }
          else {
            pcVar4 = (local_48->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_58,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/memalign_unittest.cc"
                     ,0x8b,pcVar4);
          testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_40);
          goto LAB_0010a5e0;
        }
        if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_48,local_48);
        }
        auVar3 = _DAT_00139090;
        if (0 < (int)uVar7) {
          lVar5 = uVar12 - 1;
          auVar17._8_4_ = (int)lVar5;
          auVar17._0_8_ = lVar5;
          auVar17._12_4_ = (int)((ulong)lVar5 >> 0x20);
          uVar8 = 0;
          auVar21 = _DAT_00139080;
          auVar39 = _DAT_00139070;
          auVar42 = _DAT_00139060;
          auVar45 = _DAT_00139050;
          auVar49 = _DAT_00139040;
          auVar53 = _DAT_00139030;
          auVar57 = _DAT_00139020;
          auVar61 = _DAT_00139010;
          do {
            auVar66 = auVar17 ^ auVar3;
            auVar82 = auVar21 ^ auVar3;
            iVar151 = auVar66._0_4_;
            iVar154 = -(uint)(iVar151 < auVar82._0_4_);
            iVar152 = auVar66._4_4_;
            auVar84._4_4_ = -(uint)(iVar152 < auVar82._4_4_);
            iVar153 = auVar66._8_4_;
            iVar170 = -(uint)(iVar153 < auVar82._8_4_);
            iVar70 = auVar66._12_4_;
            auVar84._12_4_ = -(uint)(iVar70 < auVar82._12_4_);
            auVar126._4_4_ = iVar154;
            auVar126._0_4_ = iVar154;
            auVar126._8_4_ = iVar170;
            auVar126._12_4_ = iVar170;
            auVar66 = pshuflw(in_XMM13,auVar126,0xe8);
            auVar83._4_4_ = -(uint)(auVar82._4_4_ == iVar152);
            auVar83._12_4_ = -(uint)(auVar82._12_4_ == iVar70);
            auVar83._0_4_ = auVar83._4_4_;
            auVar83._8_4_ = auVar83._12_4_;
            auVar177 = pshuflw(in_XMM14,auVar83,0xe8);
            auVar84._0_4_ = auVar84._4_4_;
            auVar84._8_4_ = auVar84._12_4_;
            auVar82 = pshuflw(auVar66,auVar84,0xe8);
            auVar178._8_4_ = 0xffffffff;
            auVar178._0_8_ = 0xffffffffffffffff;
            auVar178._12_4_ = 0xffffffff;
            auVar66 = (auVar82 | auVar177 & auVar66) ^ auVar178;
            auVar66 = packssdw(auVar66,auVar66);
            cVar20 = (char)uVar8;
            if ((auVar66 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              local_38._M_head_impl[uVar8] =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
                   (cVar20 + 'y');
            }
            auVar84 = auVar83 & auVar126 | auVar84;
            auVar66 = packssdw(auVar84,auVar84);
            auVar66 = packssdw(auVar66 ^ auVar178,auVar66 ^ auVar178);
            auVar66 = packsswb(auVar66,auVar66);
            if ((auVar66._0_4_ >> 8 & 1) != 0) {
              local_38._M_head_impl[uVar8 + 1] =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
                   (cVar20 + 'z');
            }
            auVar66 = auVar39 ^ auVar3;
            iVar154 = -(uint)(iVar151 < auVar66._0_4_);
            auVar158._4_4_ = -(uint)(iVar152 < auVar66._4_4_);
            iVar170 = -(uint)(iVar153 < auVar66._8_4_);
            auVar158._12_4_ = -(uint)(iVar70 < auVar66._12_4_);
            auVar85._4_4_ = iVar154;
            auVar85._0_4_ = iVar154;
            auVar85._8_4_ = iVar170;
            auVar85._12_4_ = iVar170;
            auVar127._4_4_ = -(uint)(auVar66._4_4_ == iVar152);
            auVar127._12_4_ = -(uint)(auVar66._12_4_ == iVar70);
            auVar127._0_4_ = auVar127._4_4_;
            auVar127._8_4_ = auVar127._12_4_;
            auVar158._0_4_ = auVar158._4_4_;
            auVar158._8_4_ = auVar158._12_4_;
            auVar66 = auVar127 & auVar85 | auVar158;
            auVar66 = packssdw(auVar66,auVar66);
            auVar66 = packssdw(auVar66 ^ auVar178,auVar66 ^ auVar178);
            auVar66 = packsswb(auVar66,auVar66);
            if ((auVar66._0_4_ >> 0x10 & 1) != 0) {
              local_38._M_head_impl[uVar8 + 2] =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
                   (cVar20 + '{');
            }
            auVar82 = pshufhw(auVar85,auVar85,0x84);
            auVar128 = pshufhw(auVar127,auVar127,0x84);
            auVar177 = pshufhw(auVar82,auVar158,0x84);
            auVar82 = (auVar177 | auVar128 & auVar82) ^ auVar178;
            auVar82 = packssdw(auVar82,auVar82);
            auVar82 = packsswb(auVar82,auVar82);
            if ((auVar82._0_4_ >> 0x18 & 1) != 0) {
              local_38._M_head_impl[uVar8 + 3] =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
                   (cVar20 + '|');
            }
            auVar82 = auVar42 ^ auVar3;
            iVar154 = -(uint)(iVar151 < auVar82._0_4_);
            auVar87._4_4_ = -(uint)(iVar152 < auVar82._4_4_);
            iVar170 = -(uint)(iVar153 < auVar82._8_4_);
            auVar87._12_4_ = -(uint)(iVar70 < auVar82._12_4_);
            auVar129._4_4_ = iVar154;
            auVar129._0_4_ = iVar154;
            auVar129._8_4_ = iVar170;
            auVar129._12_4_ = iVar170;
            auVar66 = pshuflw(auVar66,auVar129,0xe8);
            auVar86._4_4_ = -(uint)(auVar82._4_4_ == iVar152);
            auVar86._12_4_ = -(uint)(auVar82._12_4_ == iVar70);
            auVar86._0_4_ = auVar86._4_4_;
            auVar86._8_4_ = auVar86._12_4_;
            auVar177 = pshuflw(auVar178,auVar86,0xe8);
            auVar87._0_4_ = auVar87._4_4_;
            auVar87._8_4_ = auVar87._12_4_;
            auVar82 = pshuflw(auVar66,auVar87,0xe8);
            auVar179._8_4_ = 0xffffffff;
            auVar179._0_8_ = 0xffffffffffffffff;
            auVar179._12_4_ = 0xffffffff;
            auVar66 = (auVar82 | auVar177 & auVar66) ^ auVar179;
            auVar66 = packssdw(auVar66,auVar66);
            auVar66 = packsswb(auVar66,auVar66);
            if ((auVar66 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              local_38._M_head_impl[uVar8 + 4] =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
                   (cVar20 + '}');
            }
            auVar87 = auVar86 & auVar129 | auVar87;
            auVar66 = packssdw(auVar87,auVar87);
            auVar66 = packssdw(auVar66 ^ auVar179,auVar66 ^ auVar179);
            auVar66 = packsswb(auVar66,auVar66);
            if ((auVar66._4_2_ >> 8 & 1) != 0) {
              local_38._M_head_impl[uVar8 + 5] =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
                   (cVar20 + '~');
            }
            auVar66 = auVar45 ^ auVar3;
            iVar154 = -(uint)(iVar151 < auVar66._0_4_);
            auVar159._4_4_ = -(uint)(iVar152 < auVar66._4_4_);
            iVar170 = -(uint)(iVar153 < auVar66._8_4_);
            auVar159._12_4_ = -(uint)(iVar70 < auVar66._12_4_);
            auVar88._4_4_ = iVar154;
            auVar88._0_4_ = iVar154;
            auVar88._8_4_ = iVar170;
            auVar88._12_4_ = iVar170;
            auVar130._4_4_ = -(uint)(auVar66._4_4_ == iVar152);
            auVar130._12_4_ = -(uint)(auVar66._12_4_ == iVar70);
            auVar130._0_4_ = auVar130._4_4_;
            auVar130._8_4_ = auVar130._12_4_;
            auVar159._0_4_ = auVar159._4_4_;
            auVar159._8_4_ = auVar159._12_4_;
            auVar66 = auVar130 & auVar88 | auVar159;
            auVar66 = packssdw(auVar66,auVar66);
            auVar66 = packssdw(auVar66 ^ auVar179,auVar66 ^ auVar179);
            auVar66 = packsswb(auVar66,auVar66);
            if ((auVar66 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              local_38._M_head_impl[uVar8 + 6] =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
                   (cVar20 + '\x7f');
            }
            auVar82 = pshufhw(auVar88,auVar88,0x84);
            auVar128 = pshufhw(auVar130,auVar130,0x84);
            auVar177 = pshufhw(auVar82,auVar159,0x84);
            auVar82 = (auVar177 | auVar128 & auVar82) ^ auVar179;
            auVar82 = packssdw(auVar82,auVar82);
            auVar82 = packsswb(auVar82,auVar82);
            if ((auVar82._6_2_ >> 8 & 1) != 0) {
              local_38._M_head_impl[uVar8 + 7] =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
                   (cVar20 + -0x80);
            }
            auVar82 = auVar49 ^ auVar3;
            iVar154 = -(uint)(iVar151 < auVar82._0_4_);
            auVar90._4_4_ = -(uint)(iVar152 < auVar82._4_4_);
            iVar170 = -(uint)(iVar153 < auVar82._8_4_);
            auVar90._12_4_ = -(uint)(iVar70 < auVar82._12_4_);
            auVar131._4_4_ = iVar154;
            auVar131._0_4_ = iVar154;
            auVar131._8_4_ = iVar170;
            auVar131._12_4_ = iVar170;
            auVar66 = pshuflw(auVar66,auVar131,0xe8);
            auVar89._4_4_ = -(uint)(auVar82._4_4_ == iVar152);
            auVar89._12_4_ = -(uint)(auVar82._12_4_ == iVar70);
            auVar89._0_4_ = auVar89._4_4_;
            auVar89._8_4_ = auVar89._12_4_;
            auVar177 = pshuflw(auVar179,auVar89,0xe8);
            auVar90._0_4_ = auVar90._4_4_;
            auVar90._8_4_ = auVar90._12_4_;
            auVar82 = pshuflw(auVar66,auVar90,0xe8);
            auVar180._8_4_ = 0xffffffff;
            auVar180._0_8_ = 0xffffffffffffffff;
            auVar180._12_4_ = 0xffffffff;
            auVar66 = (auVar82 | auVar177 & auVar66) ^ auVar180;
            auVar66 = packssdw(auVar66,auVar66);
            auVar66 = packsswb(auVar66,auVar66);
            if ((auVar66 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              local_38._M_head_impl[uVar8 + 8] =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
                   (cVar20 + -0x7f);
            }
            auVar90 = auVar89 & auVar131 | auVar90;
            auVar66 = packssdw(auVar90,auVar90);
            auVar66 = packssdw(auVar66 ^ auVar180,auVar66 ^ auVar180);
            auVar66 = packsswb(auVar66,auVar66);
            if ((auVar66._8_2_ >> 8 & 1) != 0) {
              local_38._M_head_impl[uVar8 + 9] =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
                   (cVar20 + -0x7e);
            }
            auVar66 = auVar53 ^ auVar3;
            iVar154 = -(uint)(iVar151 < auVar66._0_4_);
            auVar160._4_4_ = -(uint)(iVar152 < auVar66._4_4_);
            iVar170 = -(uint)(iVar153 < auVar66._8_4_);
            auVar160._12_4_ = -(uint)(iVar70 < auVar66._12_4_);
            auVar91._4_4_ = iVar154;
            auVar91._0_4_ = iVar154;
            auVar91._8_4_ = iVar170;
            auVar91._12_4_ = iVar170;
            auVar132._4_4_ = -(uint)(auVar66._4_4_ == iVar152);
            auVar132._12_4_ = -(uint)(auVar66._12_4_ == iVar70);
            auVar132._0_4_ = auVar132._4_4_;
            auVar132._8_4_ = auVar132._12_4_;
            auVar160._0_4_ = auVar160._4_4_;
            auVar160._8_4_ = auVar160._12_4_;
            auVar66 = auVar132 & auVar91 | auVar160;
            auVar66 = packssdw(auVar66,auVar66);
            auVar66 = packssdw(auVar66 ^ auVar180,auVar66 ^ auVar180);
            auVar66 = packsswb(auVar66,auVar66);
            if ((auVar66 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
              local_38._M_head_impl[uVar8 + 10] =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
                   (cVar20 + -0x7d);
            }
            auVar82 = pshufhw(auVar91,auVar91,0x84);
            auVar128 = pshufhw(auVar132,auVar132,0x84);
            auVar177 = pshufhw(auVar82,auVar160,0x84);
            auVar82 = (auVar177 | auVar128 & auVar82) ^ auVar180;
            auVar82 = packssdw(auVar82,auVar82);
            auVar82 = packsswb(auVar82,auVar82);
            if ((auVar82._10_2_ >> 8 & 1) != 0) {
              local_38._M_head_impl[uVar8 + 0xb] =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
                   (cVar20 + -0x7c);
            }
            auVar82 = auVar57 ^ auVar3;
            iVar154 = -(uint)(iVar151 < auVar82._0_4_);
            auVar93._4_4_ = -(uint)(iVar152 < auVar82._4_4_);
            iVar170 = -(uint)(iVar153 < auVar82._8_4_);
            auVar93._12_4_ = -(uint)(iVar70 < auVar82._12_4_);
            auVar133._4_4_ = iVar154;
            auVar133._0_4_ = iVar154;
            auVar133._8_4_ = iVar170;
            auVar133._12_4_ = iVar170;
            auVar66 = pshuflw(auVar66,auVar133,0xe8);
            auVar92._4_4_ = -(uint)(auVar82._4_4_ == iVar152);
            auVar92._12_4_ = -(uint)(auVar82._12_4_ == iVar70);
            auVar92._0_4_ = auVar92._4_4_;
            auVar92._8_4_ = auVar92._12_4_;
            auVar177 = pshuflw(auVar180,auVar92,0xe8);
            auVar93._0_4_ = auVar93._4_4_;
            auVar93._8_4_ = auVar93._12_4_;
            auVar82 = pshuflw(auVar66,auVar93,0xe8);
            in_XMM14._8_4_ = 0xffffffff;
            in_XMM14._0_8_ = 0xffffffffffffffff;
            in_XMM14._12_4_ = 0xffffffff;
            auVar66 = (auVar82 | auVar177 & auVar66) ^ in_XMM14;
            auVar66 = packssdw(auVar66,auVar66);
            auVar66 = packsswb(auVar66,auVar66);
            if ((auVar66 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              local_38._M_head_impl[uVar8 + 0xc] =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
                   (cVar20 + -0x7b);
            }
            auVar93 = auVar92 & auVar133 | auVar93;
            auVar66 = packssdw(auVar93,auVar93);
            auVar66 = packssdw(auVar66 ^ in_XMM14,auVar66 ^ in_XMM14);
            auVar66 = packsswb(auVar66,auVar66);
            if ((auVar66._12_2_ >> 8 & 1) != 0) {
              local_38._M_head_impl[uVar8 + 0xd] =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
                   (cVar20 + -0x7a);
            }
            auVar66 = auVar61 ^ auVar3;
            auVar161._0_4_ = -(uint)(iVar151 < auVar66._0_4_);
            auVar161._4_4_ = -(uint)(iVar152 < auVar66._4_4_);
            auVar161._8_4_ = -(uint)(iVar153 < auVar66._8_4_);
            auVar161._12_4_ = -(uint)(iVar70 < auVar66._12_4_);
            auVar94._4_4_ = auVar161._0_4_;
            auVar94._0_4_ = auVar161._0_4_;
            auVar94._8_4_ = auVar161._8_4_;
            auVar94._12_4_ = auVar161._8_4_;
            iVar151 = -(uint)(auVar66._4_4_ == iVar152);
            iVar152 = -(uint)(auVar66._12_4_ == iVar70);
            auVar67._4_4_ = iVar151;
            auVar67._0_4_ = iVar151;
            auVar67._8_4_ = iVar152;
            auVar67._12_4_ = iVar152;
            auVar134._4_4_ = auVar161._4_4_;
            auVar134._0_4_ = auVar161._4_4_;
            auVar134._8_4_ = auVar161._12_4_;
            auVar134._12_4_ = auVar161._12_4_;
            in_XMM13 = auVar67 & auVar94 | auVar134;
            auVar66 = packssdw(auVar161,in_XMM13);
            auVar66 = packssdw(auVar66 ^ in_XMM14,auVar66 ^ in_XMM14);
            auVar66 = packsswb(auVar66,auVar66);
            if ((auVar66 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              local_38._M_head_impl[uVar8 + 0xe] =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
                   (cVar20 + -0x79);
            }
            auVar82 = pshufhw(auVar94,auVar94,0x84);
            auVar66 = pshufhw(auVar67,auVar67,0x84);
            auVar177 = pshufhw(auVar82,auVar134,0x84);
            auVar66 = packssdw(auVar66 & auVar82,(auVar177 | auVar66 & auVar82) ^ in_XMM14);
            auVar66 = packsswb(auVar66,auVar66);
            if ((auVar66._14_2_ >> 8 & 1) != 0) {
              local_38._M_head_impl[uVar8 + 0xf] =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
                   (cVar20 + -0x78);
            }
            uVar8 = uVar8 + 0x10;
            lVar5 = auVar21._8_8_;
            auVar21._0_8_ = auVar21._0_8_ + 0x10;
            auVar21._8_8_ = lVar5 + 0x10;
            lVar5 = auVar39._8_8_;
            auVar39._0_8_ = auVar39._0_8_ + 0x10;
            auVar39._8_8_ = lVar5 + 0x10;
            lVar5 = auVar42._8_8_;
            auVar42._0_8_ = auVar42._0_8_ + 0x10;
            auVar42._8_8_ = lVar5 + 0x10;
            lVar5 = auVar45._8_8_;
            auVar45._0_8_ = auVar45._0_8_ + 0x10;
            auVar45._8_8_ = lVar5 + 0x10;
            lVar5 = auVar49._8_8_;
            auVar49._0_8_ = auVar49._0_8_ + 0x10;
            auVar49._8_8_ = lVar5 + 0x10;
            lVar5 = auVar53._8_8_;
            auVar53._0_8_ = auVar53._0_8_ + 0x10;
            auVar53._8_8_ = lVar5 + 0x10;
            lVar5 = auVar57._8_8_;
            auVar57._0_8_ = auVar57._0_8_ + 0x10;
            auVar57._8_8_ = lVar5 + 0x10;
            lVar5 = auVar61._8_8_;
            auVar61._0_8_ = auVar61._0_8_ + 0x10;
            auVar61._8_8_ = lVar5 + 0x10;
          } while ((uVar7 + 0xf & 0xfffffff0) != uVar8);
          if (0 < (int)uVar7) {
            if (*local_38._M_head_impl ==
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)0x79) {
              uVar8 = 1;
              do {
                uVar9 = uVar8;
                if (uVar12 == uVar9) break;
                uVar8 = uVar9 + 1;
              } while ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
                       ((char)(uVar9 + 1) + 'x') == local_38._M_head_impl[uVar9]);
              if (uVar12 <= uVar9) goto LAB_0010945a;
            }
            pcVar4 = "Check failed: Valid(ptr, s, \'y\')\n";
            goto LAB_0010a7b5;
          }
        }
LAB_0010945a:
        free(local_38._M_head_impl);
      }
      if ((int)uVar7 < 100) {
        uVar7 = uVar7 + 1;
      }
      else {
        if (0xfffff < uVar7) break;
        iVar151 = 1;
        do {
          iVar152 = iVar151;
          iVar151 = iVar152 * 2;
        } while (iVar152 < (int)uVar7);
        uVar1 = iVar152 - 1;
        bVar15 = uVar1 != uVar7;
        bVar14 = (int)uVar1 <= (int)uVar7;
        uVar7 = uVar1;
        if (bVar14) {
          uVar7 = iVar152 + (uint)bVar15;
        }
      }
    } while (uVar7 != 0xffffffff);
    bVar14 = uVar13 < 0x80000;
    uVar13 = uVar13 * 2;
  } while (bVar14);
  pcVar4 = (char *)memalign(0x100000,0x80000);
  __ptr = (char *)memalign(0x80000,0x80000);
  __ptr_00 = (char *)memalign(0x200000,0x80000);
  local_38._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_40._M_head_impl = local_40._M_head_impl & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&local_50,"Misallignment(p1, 1<<20)","0",(unsigned_long *)&local_38,
             (int *)&local_40);
  if (local_50._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_48 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_48->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_40,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/memalign_unittest.cc"
               ,0x98,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_40,(Message *)&local_38);
LAB_0010a780:
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_40);
    _Var11._M_head_impl = local_38._M_head_impl;
LAB_0010a5ed:
    if (_Var11._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)_Var11._M_head_impl + 8))();
    }
    if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_48,local_48);
    }
    return;
  }
  if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,local_48);
  }
  local_38._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_40._M_head_impl = local_40._M_head_impl & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&local_50,"Misallignment(p2, 1<<19)","0",(unsigned_long *)&local_38,
             (int *)&local_40);
  if (local_50._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_48 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_48->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_40,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/memalign_unittest.cc"
               ,0x99,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_40,(Message *)&local_38);
    goto LAB_0010a780;
  }
  if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,local_48);
  }
  local_38._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_40._M_head_impl = local_40._M_head_impl & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&local_50,"Misallignment(p3, 1<<21)","0",(unsigned_long *)&local_38,
             (int *)&local_40);
  if (local_50._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_48 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_48->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_40,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/memalign_unittest.cc"
               ,0x9a,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_40,(Message *)&local_38);
    goto LAB_0010a780;
  }
  if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,local_48);
  }
  cVar20 = '\0';
  cVar24 = '\x01';
  cVar25 = '\x02';
  cVar26 = '\x03';
  cVar27 = '\x04';
  cVar28 = '\x05';
  cVar29 = '\x06';
  cVar30 = '\a';
  cVar31 = '\b';
  cVar32 = '\t';
  cVar33 = '\n';
  cVar34 = '\v';
  cVar35 = '\f';
  cVar36 = '\r';
  cVar37 = '\x0e';
  cVar38 = '\x0f';
  lVar5 = 0;
  do {
    pcVar2 = pcVar4 + lVar5;
    *pcVar2 = cVar20 + 'a';
    pcVar2[1] = cVar24 + 'a';
    pcVar2[2] = cVar25 + 'a';
    pcVar2[3] = cVar26 + 'a';
    pcVar2[4] = cVar27 + 'a';
    pcVar2[5] = cVar28 + 'a';
    pcVar2[6] = cVar29 + 'a';
    pcVar2[7] = cVar30 + 'a';
    pcVar2[8] = cVar31 + 'a';
    pcVar2[9] = cVar32 + 'a';
    pcVar2[10] = cVar33 + 'a';
    pcVar2[0xb] = cVar34 + 'a';
    pcVar2[0xc] = cVar35 + 'a';
    pcVar2[0xd] = cVar36 + 'a';
    pcVar2[0xe] = cVar37 + 'a';
    pcVar2[0xf] = cVar38 + 'a';
    lVar5 = lVar5 + 0x10;
    cVar20 = cVar20 + '\x10';
    cVar24 = cVar24 + '\x10';
    cVar25 = cVar25 + '\x10';
    cVar26 = cVar26 + '\x10';
    cVar27 = cVar27 + '\x10';
    cVar28 = cVar28 + '\x10';
    cVar29 = cVar29 + '\x10';
    cVar30 = cVar30 + '\x10';
    cVar31 = cVar31 + '\x10';
    cVar32 = cVar32 + '\x10';
    cVar33 = cVar33 + '\x10';
    cVar34 = cVar34 + '\x10';
    cVar35 = cVar35 + '\x10';
    cVar36 = cVar36 + '\x10';
    cVar37 = cVar37 + '\x10';
    cVar38 = cVar38 + '\x10';
  } while (lVar5 != 0x80000);
  cVar20 = '\0';
  cVar24 = '\x01';
  cVar25 = '\x02';
  cVar26 = '\x03';
  cVar27 = '\x04';
  cVar28 = '\x05';
  cVar29 = '\x06';
  cVar30 = '\a';
  cVar31 = '\b';
  cVar32 = '\t';
  cVar33 = '\n';
  cVar34 = '\v';
  cVar35 = '\f';
  cVar36 = '\r';
  cVar37 = '\x0e';
  cVar38 = '\x0f';
  lVar5 = 0;
  do {
    pcVar2 = __ptr + lVar5;
    *pcVar2 = cVar20 + 'b';
    pcVar2[1] = cVar24 + 'b';
    pcVar2[2] = cVar25 + 'b';
    pcVar2[3] = cVar26 + 'b';
    pcVar2[4] = cVar27 + 'b';
    pcVar2[5] = cVar28 + 'b';
    pcVar2[6] = cVar29 + 'b';
    pcVar2[7] = cVar30 + 'b';
    pcVar2[8] = cVar31 + 'b';
    pcVar2[9] = cVar32 + 'b';
    pcVar2[10] = cVar33 + 'b';
    pcVar2[0xb] = cVar34 + 'b';
    pcVar2[0xc] = cVar35 + 'b';
    pcVar2[0xd] = cVar36 + 'b';
    pcVar2[0xe] = cVar37 + 'b';
    pcVar2[0xf] = cVar38 + 'b';
    lVar5 = lVar5 + 0x10;
    cVar20 = cVar20 + '\x10';
    cVar24 = cVar24 + '\x10';
    cVar25 = cVar25 + '\x10';
    cVar26 = cVar26 + '\x10';
    cVar27 = cVar27 + '\x10';
    cVar28 = cVar28 + '\x10';
    cVar29 = cVar29 + '\x10';
    cVar30 = cVar30 + '\x10';
    cVar31 = cVar31 + '\x10';
    cVar32 = cVar32 + '\x10';
    cVar33 = cVar33 + '\x10';
    cVar34 = cVar34 + '\x10';
    cVar35 = cVar35 + '\x10';
    cVar36 = cVar36 + '\x10';
    cVar37 = cVar37 + '\x10';
    cVar38 = cVar38 + '\x10';
  } while (lVar5 != 0x80000);
  cVar20 = '\0';
  cVar24 = '\x01';
  cVar25 = '\x02';
  cVar26 = '\x03';
  cVar27 = '\x04';
  cVar28 = '\x05';
  cVar29 = '\x06';
  cVar30 = '\a';
  cVar31 = '\b';
  cVar32 = '\t';
  cVar33 = '\n';
  cVar34 = '\v';
  cVar35 = '\f';
  cVar36 = '\r';
  cVar37 = '\x0e';
  cVar38 = '\x0f';
  lVar5 = 0;
  do {
    pcVar2 = __ptr_00 + lVar5;
    *pcVar2 = cVar20 + 'c';
    pcVar2[1] = cVar24 + 'c';
    pcVar2[2] = cVar25 + 'c';
    pcVar2[3] = cVar26 + 'c';
    pcVar2[4] = cVar27 + 'c';
    pcVar2[5] = cVar28 + 'c';
    pcVar2[6] = cVar29 + 'c';
    pcVar2[7] = cVar30 + 'c';
    pcVar2[8] = cVar31 + 'c';
    pcVar2[9] = cVar32 + 'c';
    pcVar2[10] = cVar33 + 'c';
    pcVar2[0xb] = cVar34 + 'c';
    pcVar2[0xc] = cVar35 + 'c';
    pcVar2[0xd] = cVar36 + 'c';
    pcVar2[0xe] = cVar37 + 'c';
    pcVar2[0xf] = cVar38 + 'c';
    lVar5 = lVar5 + 0x10;
    cVar20 = cVar20 + '\x10';
    cVar24 = cVar24 + '\x10';
    cVar25 = cVar25 + '\x10';
    cVar26 = cVar26 + '\x10';
    cVar27 = cVar27 + '\x10';
    cVar28 = cVar28 + '\x10';
    cVar29 = cVar29 + '\x10';
    cVar30 = cVar30 + '\x10';
    cVar31 = cVar31 + '\x10';
    cVar32 = cVar32 + '\x10';
    cVar33 = cVar33 + '\x10';
    cVar34 = cVar34 + '\x10';
    cVar35 = cVar35 + '\x10';
    cVar36 = cVar36 + '\x10';
    cVar37 = cVar37 + '\x10';
    cVar38 = cVar38 + '\x10';
  } while (lVar5 != 0x80000);
  if (*pcVar4 == 'a') {
    uVar6 = 0xffffffffffffffff;
    do {
      if (uVar6 == 0x7fffe) goto LAB_00109694;
      uVar12 = uVar6 + 1;
      lVar5 = uVar6 + 2;
      uVar6 = uVar12;
    } while ((char)((char)uVar12 + 'b') == pcVar4[lVar5]);
    if (uVar12 < 0x7ffff) goto LAB_0010a809;
LAB_00109694:
    if (*__ptr == 'b') {
      uVar6 = 0xffffffffffffffff;
      do {
        if (uVar6 == 0x7fffe) goto LAB_001096cb;
        uVar12 = uVar6 + 1;
        lVar5 = uVar6 + 2;
        uVar6 = uVar12;
      } while ((char)((char)uVar12 + 'c') == __ptr[lVar5]);
      if (uVar12 < 0x7ffff) goto LAB_0010a812;
LAB_001096cb:
      if (*__ptr_00 == 'c') {
        uVar6 = 0xffffffffffffffff;
        do {
          if (uVar6 == 0x7fffe) goto LAB_00109702;
          uVar12 = uVar6 + 1;
          lVar5 = uVar6 + 2;
          uVar6 = uVar12;
        } while ((char)((char)uVar12 + 'd') == __ptr_00[lVar5]);
        if (0x7fffe < uVar12) {
LAB_00109702:
          free(pcVar4);
          free(__ptr);
          free(__ptr_00);
          iVar151 = posix_memalign(&local_38._M_head_impl,0,1);
          if (iVar151 == 0x16) {
            iVar151 = posix_memalign(&local_38._M_head_impl,4,1);
            if (iVar151 == 0x16) {
              iVar151 = posix_memalign(&local_38._M_head_impl,9,1);
              if (iVar151 == 0x16) {
                iVar151 = posix_memalign(&local_38._M_head_impl,0x1001,1);
                if (iVar151 == 0x16) {
                  local_50 = malloc;
                  (*noopt_helper)(&local_50);
                  __ptr_01 = (void *)(*local_50)(0x400000);
                  if (__ptr_01 == (void *)0x0) {
                    TestBody();
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_40);
                    if (local_38._M_head_impl !=
                        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x0) {
                      (**(code **)(*(long *)local_38._M_head_impl + 8))();
                    }
                    if (local_48 !=
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      std::
                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&local_48,local_48);
                    }
                    _Unwind_Resume(extraout_RAX);
                  }
                  __size = 0xffffffffffffffff;
                  do {
                    iVar151 = posix_memalign(&local_38._M_head_impl,0x400,__size);
                    if (iVar151 != 0xc) {
                      pcVar4 = "Check failed: r == ENOMEM\n";
                      uVar10 = 0x1a;
                      goto LAB_0010a7bf;
                    }
                    __size = __size - 1;
                  } while (__size != 0xfffffffffffffff6);
                  free(__ptr_01);
                  iVar151 = getpagesize();
                  uVar13 = 0;
                  do {
                    pcVar4 = (char *)valloc((long)(int)uVar13);
                    local_38._M_head_impl =
                         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         Misallignment(pcVar4,(long)iVar151);
                    local_40._M_head_impl = local_40._M_head_impl & 0xffffffff00000000;
                    testing::internal::CmpHelperEQ<unsigned_long,int>
                              ((internal *)&local_50,"Misallignment(p, pagesize)","0",
                               (unsigned_long *)&local_38,(int *)&local_40);
                    if (local_50._0_1_ == (internal)0x0) {
                      testing::Message::Message((Message *)&local_38);
                      if (local_48 ==
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                      {
                        pcVar4 = "";
                      }
                      else {
                        pcVar4 = (local_48->_M_dataplus)._M_p;
                      }
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&local_40,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/memalign_unittest.cc"
                                 ,0xc2,pcVar4);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)&local_40,(Message *)&local_38);
                      goto LAB_0010a780;
                    }
                    if (local_48 !=
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      std::
                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&local_48,local_48);
                    }
                    auVar3 = _DAT_00139090;
                    uVar6 = (ulong)uVar13;
                    if (0 < (int)uVar13) {
                      lVar5 = uVar6 - 1;
                      auVar18._8_4_ = (int)lVar5;
                      auVar18._0_8_ = lVar5;
                      auVar18._12_4_ = (int)((ulong)lVar5 >> 0x20);
                      uVar12 = 0;
                      auVar22 = _DAT_00139080;
                      auVar40 = _DAT_00139070;
                      auVar43 = _DAT_00139060;
                      auVar46 = _DAT_00139050;
                      auVar50 = _DAT_00139040;
                      auVar54 = _DAT_00139030;
                      auVar58 = _DAT_00139020;
                      auVar62 = _DAT_00139010;
                      do {
                        auVar66 = auVar18 ^ auVar3;
                        auVar82 = auVar22 ^ auVar3;
                        iVar152 = auVar66._0_4_;
                        iVar170 = -(uint)(iVar152 < auVar82._0_4_);
                        iVar153 = auVar66._4_4_;
                        auVar96._4_4_ = -(uint)(iVar153 < auVar82._4_4_);
                        iVar70 = auVar66._8_4_;
                        iVar171 = -(uint)(iVar70 < auVar82._8_4_);
                        iVar154 = auVar66._12_4_;
                        auVar96._12_4_ = -(uint)(iVar154 < auVar82._12_4_);
                        auVar135._4_4_ = iVar170;
                        auVar135._0_4_ = iVar170;
                        auVar135._8_4_ = iVar171;
                        auVar135._12_4_ = iVar171;
                        auVar66 = pshuflw(in_XMM13,auVar135,0xe8);
                        auVar95._4_4_ = -(uint)(auVar82._4_4_ == iVar153);
                        auVar95._12_4_ = -(uint)(auVar82._12_4_ == iVar154);
                        auVar95._0_4_ = auVar95._4_4_;
                        auVar95._8_4_ = auVar95._12_4_;
                        auVar177 = pshuflw(in_XMM14,auVar95,0xe8);
                        auVar96._0_4_ = auVar96._4_4_;
                        auVar96._8_4_ = auVar96._12_4_;
                        auVar82 = pshuflw(auVar66,auVar96,0xe8);
                        auVar181._8_4_ = 0xffffffff;
                        auVar181._0_8_ = 0xffffffffffffffff;
                        auVar181._12_4_ = 0xffffffff;
                        auVar66 = (auVar82 | auVar177 & auVar66) ^ auVar181;
                        auVar66 = packssdw(auVar66,auVar66);
                        cVar20 = (char)uVar12;
                        if ((auVar66 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                          pcVar4[uVar12] = cVar20 + 'v';
                        }
                        auVar96 = auVar95 & auVar135 | auVar96;
                        auVar66 = packssdw(auVar96,auVar96);
                        auVar66 = packssdw(auVar66 ^ auVar181,auVar66 ^ auVar181);
                        auVar66 = packsswb(auVar66,auVar66);
                        if ((auVar66._0_4_ >> 8 & 1) != 0) {
                          pcVar4[uVar12 + 1] = cVar20 + 'w';
                        }
                        auVar66 = auVar40 ^ auVar3;
                        iVar170 = -(uint)(iVar152 < auVar66._0_4_);
                        auVar162._4_4_ = -(uint)(iVar153 < auVar66._4_4_);
                        iVar171 = -(uint)(iVar70 < auVar66._8_4_);
                        auVar162._12_4_ = -(uint)(iVar154 < auVar66._12_4_);
                        auVar97._4_4_ = iVar170;
                        auVar97._0_4_ = iVar170;
                        auVar97._8_4_ = iVar171;
                        auVar97._12_4_ = iVar171;
                        auVar136._4_4_ = -(uint)(auVar66._4_4_ == iVar153);
                        auVar136._12_4_ = -(uint)(auVar66._12_4_ == iVar154);
                        auVar136._0_4_ = auVar136._4_4_;
                        auVar136._8_4_ = auVar136._12_4_;
                        auVar162._0_4_ = auVar162._4_4_;
                        auVar162._8_4_ = auVar162._12_4_;
                        auVar66 = auVar136 & auVar97 | auVar162;
                        auVar66 = packssdw(auVar66,auVar66);
                        auVar66 = packssdw(auVar66 ^ auVar181,auVar66 ^ auVar181);
                        auVar66 = packsswb(auVar66,auVar66);
                        if ((auVar66._0_4_ >> 0x10 & 1) != 0) {
                          pcVar4[uVar12 + 2] = cVar20 + 'x';
                        }
                        auVar82 = pshufhw(auVar97,auVar97,0x84);
                        auVar128 = pshufhw(auVar136,auVar136,0x84);
                        auVar177 = pshufhw(auVar82,auVar162,0x84);
                        auVar82 = (auVar177 | auVar128 & auVar82) ^ auVar181;
                        auVar82 = packssdw(auVar82,auVar82);
                        auVar82 = packsswb(auVar82,auVar82);
                        if ((auVar82._0_4_ >> 0x18 & 1) != 0) {
                          pcVar4[uVar12 + 3] = cVar20 + 'y';
                        }
                        auVar82 = auVar43 ^ auVar3;
                        iVar170 = -(uint)(iVar152 < auVar82._0_4_);
                        auVar99._4_4_ = -(uint)(iVar153 < auVar82._4_4_);
                        iVar171 = -(uint)(iVar70 < auVar82._8_4_);
                        auVar99._12_4_ = -(uint)(iVar154 < auVar82._12_4_);
                        auVar137._4_4_ = iVar170;
                        auVar137._0_4_ = iVar170;
                        auVar137._8_4_ = iVar171;
                        auVar137._12_4_ = iVar171;
                        auVar66 = pshuflw(auVar66,auVar137,0xe8);
                        auVar98._4_4_ = -(uint)(auVar82._4_4_ == iVar153);
                        auVar98._12_4_ = -(uint)(auVar82._12_4_ == iVar154);
                        auVar98._0_4_ = auVar98._4_4_;
                        auVar98._8_4_ = auVar98._12_4_;
                        auVar177 = pshuflw(auVar181,auVar98,0xe8);
                        auVar99._0_4_ = auVar99._4_4_;
                        auVar99._8_4_ = auVar99._12_4_;
                        auVar82 = pshuflw(auVar66,auVar99,0xe8);
                        auVar182._8_4_ = 0xffffffff;
                        auVar182._0_8_ = 0xffffffffffffffff;
                        auVar182._12_4_ = 0xffffffff;
                        auVar66 = (auVar82 | auVar177 & auVar66) ^ auVar182;
                        auVar66 = packssdw(auVar66,auVar66);
                        auVar66 = packsswb(auVar66,auVar66);
                        if ((auVar66 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                          pcVar4[uVar12 + 4] = cVar20 + 'z';
                        }
                        auVar99 = auVar98 & auVar137 | auVar99;
                        auVar66 = packssdw(auVar99,auVar99);
                        auVar66 = packssdw(auVar66 ^ auVar182,auVar66 ^ auVar182);
                        auVar66 = packsswb(auVar66,auVar66);
                        if ((auVar66._4_2_ >> 8 & 1) != 0) {
                          pcVar4[uVar12 + 5] = cVar20 + '{';
                        }
                        auVar66 = auVar46 ^ auVar3;
                        iVar170 = -(uint)(iVar152 < auVar66._0_4_);
                        auVar163._4_4_ = -(uint)(iVar153 < auVar66._4_4_);
                        iVar171 = -(uint)(iVar70 < auVar66._8_4_);
                        auVar163._12_4_ = -(uint)(iVar154 < auVar66._12_4_);
                        auVar100._4_4_ = iVar170;
                        auVar100._0_4_ = iVar170;
                        auVar100._8_4_ = iVar171;
                        auVar100._12_4_ = iVar171;
                        auVar138._4_4_ = -(uint)(auVar66._4_4_ == iVar153);
                        auVar138._12_4_ = -(uint)(auVar66._12_4_ == iVar154);
                        auVar138._0_4_ = auVar138._4_4_;
                        auVar138._8_4_ = auVar138._12_4_;
                        auVar163._0_4_ = auVar163._4_4_;
                        auVar163._8_4_ = auVar163._12_4_;
                        auVar66 = auVar138 & auVar100 | auVar163;
                        auVar66 = packssdw(auVar66,auVar66);
                        auVar66 = packssdw(auVar66 ^ auVar182,auVar66 ^ auVar182);
                        auVar66 = packsswb(auVar66,auVar66);
                        if ((auVar66 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0)
                        {
                          pcVar4[uVar12 + 6] = cVar20 + '|';
                        }
                        auVar82 = pshufhw(auVar100,auVar100,0x84);
                        auVar128 = pshufhw(auVar138,auVar138,0x84);
                        auVar177 = pshufhw(auVar82,auVar163,0x84);
                        auVar82 = (auVar177 | auVar128 & auVar82) ^ auVar182;
                        auVar82 = packssdw(auVar82,auVar82);
                        auVar82 = packsswb(auVar82,auVar82);
                        if ((auVar82._6_2_ >> 8 & 1) != 0) {
                          pcVar4[uVar12 + 7] = cVar20 + '}';
                        }
                        auVar82 = auVar50 ^ auVar3;
                        iVar170 = -(uint)(iVar152 < auVar82._0_4_);
                        auVar102._4_4_ = -(uint)(iVar153 < auVar82._4_4_);
                        iVar171 = -(uint)(iVar70 < auVar82._8_4_);
                        auVar102._12_4_ = -(uint)(iVar154 < auVar82._12_4_);
                        auVar139._4_4_ = iVar170;
                        auVar139._0_4_ = iVar170;
                        auVar139._8_4_ = iVar171;
                        auVar139._12_4_ = iVar171;
                        auVar66 = pshuflw(auVar66,auVar139,0xe8);
                        auVar101._4_4_ = -(uint)(auVar82._4_4_ == iVar153);
                        auVar101._12_4_ = -(uint)(auVar82._12_4_ == iVar154);
                        auVar101._0_4_ = auVar101._4_4_;
                        auVar101._8_4_ = auVar101._12_4_;
                        auVar177 = pshuflw(auVar182,auVar101,0xe8);
                        auVar102._0_4_ = auVar102._4_4_;
                        auVar102._8_4_ = auVar102._12_4_;
                        auVar82 = pshuflw(auVar66,auVar102,0xe8);
                        auVar183._8_4_ = 0xffffffff;
                        auVar183._0_8_ = 0xffffffffffffffff;
                        auVar183._12_4_ = 0xffffffff;
                        auVar66 = (auVar82 | auVar177 & auVar66) ^ auVar183;
                        auVar66 = packssdw(auVar66,auVar66);
                        auVar66 = packsswb(auVar66,auVar66);
                        if ((auVar66 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                          pcVar4[uVar12 + 8] = cVar20 + '~';
                        }
                        auVar102 = auVar101 & auVar139 | auVar102;
                        auVar66 = packssdw(auVar102,auVar102);
                        auVar66 = packssdw(auVar66 ^ auVar183,auVar66 ^ auVar183);
                        auVar66 = packsswb(auVar66,auVar66);
                        if ((auVar66._8_2_ >> 8 & 1) != 0) {
                          pcVar4[uVar12 + 9] = cVar20 + '\x7f';
                        }
                        auVar66 = auVar54 ^ auVar3;
                        iVar170 = -(uint)(iVar152 < auVar66._0_4_);
                        auVar164._4_4_ = -(uint)(iVar153 < auVar66._4_4_);
                        iVar171 = -(uint)(iVar70 < auVar66._8_4_);
                        auVar164._12_4_ = -(uint)(iVar154 < auVar66._12_4_);
                        auVar103._4_4_ = iVar170;
                        auVar103._0_4_ = iVar170;
                        auVar103._8_4_ = iVar171;
                        auVar103._12_4_ = iVar171;
                        auVar140._4_4_ = -(uint)(auVar66._4_4_ == iVar153);
                        auVar140._12_4_ = -(uint)(auVar66._12_4_ == iVar154);
                        auVar140._0_4_ = auVar140._4_4_;
                        auVar140._8_4_ = auVar140._12_4_;
                        auVar164._0_4_ = auVar164._4_4_;
                        auVar164._8_4_ = auVar164._12_4_;
                        auVar66 = auVar140 & auVar103 | auVar164;
                        auVar66 = packssdw(auVar66,auVar66);
                        auVar66 = packssdw(auVar66 ^ auVar183,auVar66 ^ auVar183);
                        auVar66 = packsswb(auVar66,auVar66);
                        if ((auVar66 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                          pcVar4[uVar12 + 10] = cVar20 + -0x80;
                        }
                        auVar82 = pshufhw(auVar103,auVar103,0x84);
                        auVar128 = pshufhw(auVar140,auVar140,0x84);
                        auVar177 = pshufhw(auVar82,auVar164,0x84);
                        auVar82 = (auVar177 | auVar128 & auVar82) ^ auVar183;
                        auVar82 = packssdw(auVar82,auVar82);
                        auVar82 = packsswb(auVar82,auVar82);
                        if ((auVar82._10_2_ >> 8 & 1) != 0) {
                          pcVar4[uVar12 + 0xb] = cVar20 + -0x7f;
                        }
                        auVar82 = auVar58 ^ auVar3;
                        iVar170 = -(uint)(iVar152 < auVar82._0_4_);
                        auVar105._4_4_ = -(uint)(iVar153 < auVar82._4_4_);
                        iVar171 = -(uint)(iVar70 < auVar82._8_4_);
                        auVar105._12_4_ = -(uint)(iVar154 < auVar82._12_4_);
                        auVar141._4_4_ = iVar170;
                        auVar141._0_4_ = iVar170;
                        auVar141._8_4_ = iVar171;
                        auVar141._12_4_ = iVar171;
                        auVar66 = pshuflw(auVar66,auVar141,0xe8);
                        auVar104._4_4_ = -(uint)(auVar82._4_4_ == iVar153);
                        auVar104._12_4_ = -(uint)(auVar82._12_4_ == iVar154);
                        auVar104._0_4_ = auVar104._4_4_;
                        auVar104._8_4_ = auVar104._12_4_;
                        auVar177 = pshuflw(auVar183,auVar104,0xe8);
                        auVar105._0_4_ = auVar105._4_4_;
                        auVar105._8_4_ = auVar105._12_4_;
                        auVar82 = pshuflw(auVar66,auVar105,0xe8);
                        in_XMM14._8_4_ = 0xffffffff;
                        in_XMM14._0_8_ = 0xffffffffffffffff;
                        in_XMM14._12_4_ = 0xffffffff;
                        auVar66 = (auVar82 | auVar177 & auVar66) ^ in_XMM14;
                        auVar66 = packssdw(auVar66,auVar66);
                        auVar66 = packsswb(auVar66,auVar66);
                        if ((auVar66 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                          pcVar4[uVar12 + 0xc] = cVar20 + -0x7e;
                        }
                        auVar105 = auVar104 & auVar141 | auVar105;
                        auVar66 = packssdw(auVar105,auVar105);
                        auVar66 = packssdw(auVar66 ^ in_XMM14,auVar66 ^ in_XMM14);
                        auVar66 = packsswb(auVar66,auVar66);
                        if ((auVar66._12_2_ >> 8 & 1) != 0) {
                          pcVar4[uVar12 + 0xd] = cVar20 + -0x7d;
                        }
                        auVar66 = auVar62 ^ auVar3;
                        auVar165._0_4_ = -(uint)(iVar152 < auVar66._0_4_);
                        auVar165._4_4_ = -(uint)(iVar153 < auVar66._4_4_);
                        auVar165._8_4_ = -(uint)(iVar70 < auVar66._8_4_);
                        auVar165._12_4_ = -(uint)(iVar154 < auVar66._12_4_);
                        auVar106._4_4_ = auVar165._0_4_;
                        auVar106._0_4_ = auVar165._0_4_;
                        auVar106._8_4_ = auVar165._8_4_;
                        auVar106._12_4_ = auVar165._8_4_;
                        iVar152 = -(uint)(auVar66._4_4_ == iVar153);
                        iVar153 = -(uint)(auVar66._12_4_ == iVar154);
                        auVar68._4_4_ = iVar152;
                        auVar68._0_4_ = iVar152;
                        auVar68._8_4_ = iVar153;
                        auVar68._12_4_ = iVar153;
                        auVar142._4_4_ = auVar165._4_4_;
                        auVar142._0_4_ = auVar165._4_4_;
                        auVar142._8_4_ = auVar165._12_4_;
                        auVar142._12_4_ = auVar165._12_4_;
                        in_XMM13 = auVar68 & auVar106 | auVar142;
                        auVar66 = packssdw(auVar165,in_XMM13);
                        auVar66 = packssdw(auVar66 ^ in_XMM14,auVar66 ^ in_XMM14);
                        auVar66 = packsswb(auVar66,auVar66);
                        if ((auVar66 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0)
                        {
                          pcVar4[uVar12 + 0xe] = cVar20 + -0x7c;
                        }
                        auVar82 = pshufhw(auVar106,auVar106,0x84);
                        auVar66 = pshufhw(auVar68,auVar68,0x84);
                        auVar177 = pshufhw(auVar82,auVar142,0x84);
                        auVar66 = packssdw(auVar66 & auVar82,
                                           (auVar177 | auVar66 & auVar82) ^ in_XMM14);
                        auVar66 = packsswb(auVar66,auVar66);
                        if ((auVar66._14_2_ >> 8 & 1) != 0) {
                          pcVar4[uVar12 + 0xf] = cVar20 + -0x7b;
                        }
                        uVar12 = uVar12 + 0x10;
                        lVar5 = auVar22._8_8_;
                        auVar22._0_8_ = auVar22._0_8_ + 0x10;
                        auVar22._8_8_ = lVar5 + 0x10;
                        lVar5 = auVar40._8_8_;
                        auVar40._0_8_ = auVar40._0_8_ + 0x10;
                        auVar40._8_8_ = lVar5 + 0x10;
                        lVar5 = auVar43._8_8_;
                        auVar43._0_8_ = auVar43._0_8_ + 0x10;
                        auVar43._8_8_ = lVar5 + 0x10;
                        lVar5 = auVar46._8_8_;
                        auVar46._0_8_ = auVar46._0_8_ + 0x10;
                        auVar46._8_8_ = lVar5 + 0x10;
                        lVar5 = auVar50._8_8_;
                        auVar50._0_8_ = auVar50._0_8_ + 0x10;
                        auVar50._8_8_ = lVar5 + 0x10;
                        lVar5 = auVar54._8_8_;
                        auVar54._0_8_ = auVar54._0_8_ + 0x10;
                        auVar54._8_8_ = lVar5 + 0x10;
                        lVar5 = auVar58._8_8_;
                        auVar58._0_8_ = auVar58._0_8_ + 0x10;
                        auVar58._8_8_ = lVar5 + 0x10;
                        lVar5 = auVar62._8_8_;
                        auVar62._0_8_ = auVar62._0_8_ + 0x10;
                        auVar62._8_8_ = lVar5 + 0x10;
                      } while ((uVar13 + 0xf & 0xfffffff0) != uVar12);
                      if (*pcVar4 == 'v') {
                        uVar12 = 1;
                        do {
                          uVar8 = uVar12;
                          if (uVar6 == uVar8) break;
                          uVar12 = uVar8 + 1;
                        } while ((char)((char)(uVar8 + 1) + 'u') == pcVar4[uVar8]);
                        if (uVar6 <= uVar8) {
                          free(pcVar4);
                          if ((int)uVar13 < 100) goto LAB_00109e85;
                          if (uVar13 < 0x100000) {
                            iVar152 = 1;
                            do {
                              iVar153 = iVar152;
                              iVar152 = iVar153 * 2;
                            } while (iVar153 < (int)uVar13);
                            uVar7 = iVar153 - 1;
                            if ((int)uVar7 <= (int)uVar13) {
                              uVar7 = iVar153 + (uint)(uVar7 != uVar13);
                            }
                            goto LAB_00109e8a;
                          }
                          break;
                        }
                      }
                      pcVar4 = "Check failed: Valid(p, s, \'v\')\n";
                      uVar10 = 0x1f;
                      goto LAB_0010a7bf;
                    }
                    free(pcVar4);
LAB_00109e85:
                    uVar7 = uVar13 + 1;
LAB_00109e8a:
                    uVar13 = uVar7;
                  } while (uVar13 != 0xffffffff);
                  uVar13 = 0;
                  while( true ) {
                    pcVar4 = (char *)pvalloc((long)(int)uVar13);
                    local_38._M_head_impl =
                         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         Misallignment(pcVar4,(long)iVar151);
                    local_40._M_head_impl = local_40._M_head_impl & 0xffffffff00000000;
                    testing::internal::CmpHelperEQ<unsigned_long,int>
                              ((internal *)&local_50,"Misallignment(p, pagesize)","0",
                               (unsigned_long *)&local_38,(int *)&local_40);
                    if (local_50._0_1_ == (internal)0x0) break;
                    if (local_48 !=
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      std::
                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&local_48,local_48);
                    }
                    auVar3 = _DAT_00139090;
                    iVar152 = uVar13 + iVar151 + -1;
                    uVar7 = iVar152 - iVar152 % iVar151;
                    if (uVar7 != 0 && iVar152 % iVar151 <= iVar152) {
                      uVar6 = (ulong)uVar7;
                      lVar5 = uVar6 - 1;
                      auVar19._8_4_ = (int)lVar5;
                      auVar19._0_8_ = lVar5;
                      auVar19._12_4_ = (int)((ulong)lVar5 >> 0x20);
                      uVar12 = 0;
                      auVar23 = _DAT_00139080;
                      auVar41 = _DAT_00139070;
                      auVar44 = _DAT_00139060;
                      auVar47 = _DAT_00139050;
                      auVar51 = _DAT_00139040;
                      auVar55 = _DAT_00139030;
                      auVar59 = _DAT_00139020;
                      auVar63 = _DAT_00139010;
                      do {
                        auVar66 = auVar19 ^ auVar3;
                        auVar82 = auVar23 ^ auVar3;
                        iVar152 = auVar66._0_4_;
                        iVar170 = -(uint)(iVar152 < auVar82._0_4_);
                        iVar153 = auVar66._4_4_;
                        auVar108._4_4_ = -(uint)(iVar153 < auVar82._4_4_);
                        iVar70 = auVar66._8_4_;
                        iVar171 = -(uint)(iVar70 < auVar82._8_4_);
                        iVar154 = auVar66._12_4_;
                        auVar108._12_4_ = -(uint)(iVar154 < auVar82._12_4_);
                        auVar143._4_4_ = iVar170;
                        auVar143._0_4_ = iVar170;
                        auVar143._8_4_ = iVar171;
                        auVar143._12_4_ = iVar171;
                        auVar66 = pshuflw(in_XMM13,auVar143,0xe8);
                        auVar107._4_4_ = -(uint)(auVar82._4_4_ == iVar153);
                        auVar107._12_4_ = -(uint)(auVar82._12_4_ == iVar154);
                        auVar107._0_4_ = auVar107._4_4_;
                        auVar107._8_4_ = auVar107._12_4_;
                        auVar177 = pshuflw(in_XMM14,auVar107,0xe8);
                        auVar108._0_4_ = auVar108._4_4_;
                        auVar108._8_4_ = auVar108._12_4_;
                        auVar82 = pshuflw(auVar66,auVar108,0xe8);
                        auVar184._8_4_ = 0xffffffff;
                        auVar184._0_8_ = 0xffffffffffffffff;
                        auVar184._12_4_ = 0xffffffff;
                        auVar66 = (auVar82 | auVar177 & auVar66) ^ auVar184;
                        auVar66 = packssdw(auVar66,auVar66);
                        cVar20 = (char)uVar12;
                        if ((auVar66 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                          pcVar4[uVar12] = cVar20 + 'x';
                        }
                        auVar108 = auVar107 & auVar143 | auVar108;
                        auVar66 = packssdw(auVar108,auVar108);
                        auVar66 = packssdw(auVar66 ^ auVar184,auVar66 ^ auVar184);
                        auVar66 = packsswb(auVar66,auVar66);
                        if ((auVar66._0_4_ >> 8 & 1) != 0) {
                          pcVar4[uVar12 + 1] = cVar20 + 'y';
                        }
                        auVar66 = auVar41 ^ auVar3;
                        iVar170 = -(uint)(iVar152 < auVar66._0_4_);
                        auVar166._4_4_ = -(uint)(iVar153 < auVar66._4_4_);
                        iVar171 = -(uint)(iVar70 < auVar66._8_4_);
                        auVar166._12_4_ = -(uint)(iVar154 < auVar66._12_4_);
                        auVar109._4_4_ = iVar170;
                        auVar109._0_4_ = iVar170;
                        auVar109._8_4_ = iVar171;
                        auVar109._12_4_ = iVar171;
                        auVar144._4_4_ = -(uint)(auVar66._4_4_ == iVar153);
                        auVar144._12_4_ = -(uint)(auVar66._12_4_ == iVar154);
                        auVar144._0_4_ = auVar144._4_4_;
                        auVar144._8_4_ = auVar144._12_4_;
                        auVar166._0_4_ = auVar166._4_4_;
                        auVar166._8_4_ = auVar166._12_4_;
                        auVar66 = auVar144 & auVar109 | auVar166;
                        auVar66 = packssdw(auVar66,auVar66);
                        auVar66 = packssdw(auVar66 ^ auVar184,auVar66 ^ auVar184);
                        auVar66 = packsswb(auVar66,auVar66);
                        if ((auVar66._0_4_ >> 0x10 & 1) != 0) {
                          pcVar4[uVar12 + 2] = cVar20 + 'z';
                        }
                        auVar82 = pshufhw(auVar109,auVar109,0x84);
                        auVar128 = pshufhw(auVar144,auVar144,0x84);
                        auVar177 = pshufhw(auVar82,auVar166,0x84);
                        auVar82 = (auVar177 | auVar128 & auVar82) ^ auVar184;
                        auVar82 = packssdw(auVar82,auVar82);
                        auVar82 = packsswb(auVar82,auVar82);
                        if ((auVar82._0_4_ >> 0x18 & 1) != 0) {
                          pcVar4[uVar12 + 3] = cVar20 + '{';
                        }
                        auVar82 = auVar44 ^ auVar3;
                        iVar170 = -(uint)(iVar152 < auVar82._0_4_);
                        auVar111._4_4_ = -(uint)(iVar153 < auVar82._4_4_);
                        iVar171 = -(uint)(iVar70 < auVar82._8_4_);
                        auVar111._12_4_ = -(uint)(iVar154 < auVar82._12_4_);
                        auVar145._4_4_ = iVar170;
                        auVar145._0_4_ = iVar170;
                        auVar145._8_4_ = iVar171;
                        auVar145._12_4_ = iVar171;
                        auVar66 = pshuflw(auVar66,auVar145,0xe8);
                        auVar110._4_4_ = -(uint)(auVar82._4_4_ == iVar153);
                        auVar110._12_4_ = -(uint)(auVar82._12_4_ == iVar154);
                        auVar110._0_4_ = auVar110._4_4_;
                        auVar110._8_4_ = auVar110._12_4_;
                        auVar177 = pshuflw(auVar184,auVar110,0xe8);
                        auVar111._0_4_ = auVar111._4_4_;
                        auVar111._8_4_ = auVar111._12_4_;
                        auVar82 = pshuflw(auVar66,auVar111,0xe8);
                        auVar185._8_4_ = 0xffffffff;
                        auVar185._0_8_ = 0xffffffffffffffff;
                        auVar185._12_4_ = 0xffffffff;
                        auVar66 = (auVar82 | auVar177 & auVar66) ^ auVar185;
                        auVar66 = packssdw(auVar66,auVar66);
                        auVar66 = packsswb(auVar66,auVar66);
                        if ((auVar66 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                          pcVar4[uVar12 + 4] = cVar20 + '|';
                        }
                        auVar111 = auVar110 & auVar145 | auVar111;
                        auVar66 = packssdw(auVar111,auVar111);
                        auVar66 = packssdw(auVar66 ^ auVar185,auVar66 ^ auVar185);
                        auVar66 = packsswb(auVar66,auVar66);
                        if ((auVar66._4_2_ >> 8 & 1) != 0) {
                          pcVar4[uVar12 + 5] = cVar20 + '}';
                        }
                        auVar66 = auVar47 ^ auVar3;
                        iVar170 = -(uint)(iVar152 < auVar66._0_4_);
                        auVar167._4_4_ = -(uint)(iVar153 < auVar66._4_4_);
                        iVar171 = -(uint)(iVar70 < auVar66._8_4_);
                        auVar167._12_4_ = -(uint)(iVar154 < auVar66._12_4_);
                        auVar112._4_4_ = iVar170;
                        auVar112._0_4_ = iVar170;
                        auVar112._8_4_ = iVar171;
                        auVar112._12_4_ = iVar171;
                        auVar146._4_4_ = -(uint)(auVar66._4_4_ == iVar153);
                        auVar146._12_4_ = -(uint)(auVar66._12_4_ == iVar154);
                        auVar146._0_4_ = auVar146._4_4_;
                        auVar146._8_4_ = auVar146._12_4_;
                        auVar167._0_4_ = auVar167._4_4_;
                        auVar167._8_4_ = auVar167._12_4_;
                        auVar66 = auVar146 & auVar112 | auVar167;
                        auVar66 = packssdw(auVar66,auVar66);
                        auVar66 = packssdw(auVar66 ^ auVar185,auVar66 ^ auVar185);
                        auVar66 = packsswb(auVar66,auVar66);
                        if ((auVar66 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0)
                        {
                          pcVar4[uVar12 + 6] = cVar20 + '~';
                        }
                        auVar82 = pshufhw(auVar112,auVar112,0x84);
                        auVar128 = pshufhw(auVar146,auVar146,0x84);
                        auVar177 = pshufhw(auVar82,auVar167,0x84);
                        auVar82 = (auVar177 | auVar128 & auVar82) ^ auVar185;
                        auVar82 = packssdw(auVar82,auVar82);
                        auVar82 = packsswb(auVar82,auVar82);
                        if ((auVar82._6_2_ >> 8 & 1) != 0) {
                          pcVar4[uVar12 + 7] = cVar20 + '\x7f';
                        }
                        auVar82 = auVar51 ^ auVar3;
                        iVar170 = -(uint)(iVar152 < auVar82._0_4_);
                        auVar114._4_4_ = -(uint)(iVar153 < auVar82._4_4_);
                        iVar171 = -(uint)(iVar70 < auVar82._8_4_);
                        auVar114._12_4_ = -(uint)(iVar154 < auVar82._12_4_);
                        auVar147._4_4_ = iVar170;
                        auVar147._0_4_ = iVar170;
                        auVar147._8_4_ = iVar171;
                        auVar147._12_4_ = iVar171;
                        auVar66 = pshuflw(auVar66,auVar147,0xe8);
                        auVar113._4_4_ = -(uint)(auVar82._4_4_ == iVar153);
                        auVar113._12_4_ = -(uint)(auVar82._12_4_ == iVar154);
                        auVar113._0_4_ = auVar113._4_4_;
                        auVar113._8_4_ = auVar113._12_4_;
                        auVar177 = pshuflw(auVar185,auVar113,0xe8);
                        auVar114._0_4_ = auVar114._4_4_;
                        auVar114._8_4_ = auVar114._12_4_;
                        auVar82 = pshuflw(auVar66,auVar114,0xe8);
                        auVar186._8_4_ = 0xffffffff;
                        auVar186._0_8_ = 0xffffffffffffffff;
                        auVar186._12_4_ = 0xffffffff;
                        auVar66 = (auVar82 | auVar177 & auVar66) ^ auVar186;
                        auVar66 = packssdw(auVar66,auVar66);
                        auVar66 = packsswb(auVar66,auVar66);
                        if ((auVar66 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                          pcVar4[uVar12 + 8] = cVar20 + -0x80;
                        }
                        auVar114 = auVar113 & auVar147 | auVar114;
                        auVar66 = packssdw(auVar114,auVar114);
                        auVar66 = packssdw(auVar66 ^ auVar186,auVar66 ^ auVar186);
                        auVar66 = packsswb(auVar66,auVar66);
                        if ((auVar66._8_2_ >> 8 & 1) != 0) {
                          pcVar4[uVar12 + 9] = cVar20 + -0x7f;
                        }
                        auVar66 = auVar55 ^ auVar3;
                        iVar170 = -(uint)(iVar152 < auVar66._0_4_);
                        auVar168._4_4_ = -(uint)(iVar153 < auVar66._4_4_);
                        iVar171 = -(uint)(iVar70 < auVar66._8_4_);
                        auVar168._12_4_ = -(uint)(iVar154 < auVar66._12_4_);
                        auVar115._4_4_ = iVar170;
                        auVar115._0_4_ = iVar170;
                        auVar115._8_4_ = iVar171;
                        auVar115._12_4_ = iVar171;
                        auVar148._4_4_ = -(uint)(auVar66._4_4_ == iVar153);
                        auVar148._12_4_ = -(uint)(auVar66._12_4_ == iVar154);
                        auVar148._0_4_ = auVar148._4_4_;
                        auVar148._8_4_ = auVar148._12_4_;
                        auVar168._0_4_ = auVar168._4_4_;
                        auVar168._8_4_ = auVar168._12_4_;
                        auVar66 = auVar148 & auVar115 | auVar168;
                        auVar66 = packssdw(auVar66,auVar66);
                        auVar66 = packssdw(auVar66 ^ auVar186,auVar66 ^ auVar186);
                        auVar66 = packsswb(auVar66,auVar66);
                        if ((auVar66 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                          pcVar4[uVar12 + 10] = cVar20 + -0x7e;
                        }
                        auVar82 = pshufhw(auVar115,auVar115,0x84);
                        auVar128 = pshufhw(auVar148,auVar148,0x84);
                        auVar177 = pshufhw(auVar82,auVar168,0x84);
                        auVar82 = (auVar177 | auVar128 & auVar82) ^ auVar186;
                        auVar82 = packssdw(auVar82,auVar82);
                        auVar82 = packsswb(auVar82,auVar82);
                        if ((auVar82._10_2_ >> 8 & 1) != 0) {
                          pcVar4[uVar12 + 0xb] = cVar20 + -0x7d;
                        }
                        auVar82 = auVar59 ^ auVar3;
                        iVar170 = -(uint)(iVar152 < auVar82._0_4_);
                        auVar117._4_4_ = -(uint)(iVar153 < auVar82._4_4_);
                        iVar171 = -(uint)(iVar70 < auVar82._8_4_);
                        auVar117._12_4_ = -(uint)(iVar154 < auVar82._12_4_);
                        auVar149._4_4_ = iVar170;
                        auVar149._0_4_ = iVar170;
                        auVar149._8_4_ = iVar171;
                        auVar149._12_4_ = iVar171;
                        auVar66 = pshuflw(auVar66,auVar149,0xe8);
                        auVar116._4_4_ = -(uint)(auVar82._4_4_ == iVar153);
                        auVar116._12_4_ = -(uint)(auVar82._12_4_ == iVar154);
                        auVar116._0_4_ = auVar116._4_4_;
                        auVar116._8_4_ = auVar116._12_4_;
                        auVar177 = pshuflw(auVar186,auVar116,0xe8);
                        auVar117._0_4_ = auVar117._4_4_;
                        auVar117._8_4_ = auVar117._12_4_;
                        auVar82 = pshuflw(auVar66,auVar117,0xe8);
                        in_XMM14._8_4_ = 0xffffffff;
                        in_XMM14._0_8_ = 0xffffffffffffffff;
                        in_XMM14._12_4_ = 0xffffffff;
                        auVar66 = (auVar82 | auVar177 & auVar66) ^ in_XMM14;
                        auVar66 = packssdw(auVar66,auVar66);
                        auVar66 = packsswb(auVar66,auVar66);
                        if ((auVar66 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                          pcVar4[uVar12 + 0xc] = cVar20 + -0x7c;
                        }
                        auVar117 = auVar116 & auVar149 | auVar117;
                        auVar66 = packssdw(auVar117,auVar117);
                        auVar66 = packssdw(auVar66 ^ in_XMM14,auVar66 ^ in_XMM14);
                        auVar66 = packsswb(auVar66,auVar66);
                        if ((auVar66._12_2_ >> 8 & 1) != 0) {
                          pcVar4[uVar12 + 0xd] = cVar20 + -0x7b;
                        }
                        auVar66 = auVar63 ^ auVar3;
                        auVar169._0_4_ = -(uint)(iVar152 < auVar66._0_4_);
                        auVar169._4_4_ = -(uint)(iVar153 < auVar66._4_4_);
                        auVar169._8_4_ = -(uint)(iVar70 < auVar66._8_4_);
                        auVar169._12_4_ = -(uint)(iVar154 < auVar66._12_4_);
                        auVar118._4_4_ = auVar169._0_4_;
                        auVar118._0_4_ = auVar169._0_4_;
                        auVar118._8_4_ = auVar169._8_4_;
                        auVar118._12_4_ = auVar169._8_4_;
                        iVar152 = -(uint)(auVar66._4_4_ == iVar153);
                        iVar153 = -(uint)(auVar66._12_4_ == iVar154);
                        auVar69._4_4_ = iVar152;
                        auVar69._0_4_ = iVar152;
                        auVar69._8_4_ = iVar153;
                        auVar69._12_4_ = iVar153;
                        auVar150._4_4_ = auVar169._4_4_;
                        auVar150._0_4_ = auVar169._4_4_;
                        auVar150._8_4_ = auVar169._12_4_;
                        auVar150._12_4_ = auVar169._12_4_;
                        in_XMM13 = auVar69 & auVar118 | auVar150;
                        auVar66 = packssdw(auVar169,in_XMM13);
                        auVar66 = packssdw(auVar66 ^ in_XMM14,auVar66 ^ in_XMM14);
                        auVar66 = packsswb(auVar66,auVar66);
                        if ((auVar66 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0)
                        {
                          pcVar4[uVar12 + 0xe] = cVar20 + -0x7a;
                        }
                        auVar82 = pshufhw(auVar118,auVar118,0x84);
                        auVar66 = pshufhw(auVar69,auVar69,0x84);
                        auVar177 = pshufhw(auVar82,auVar150,0x84);
                        auVar66 = packssdw(auVar66 & auVar82,
                                           (auVar177 | auVar66 & auVar82) ^ in_XMM14);
                        auVar66 = packsswb(auVar66,auVar66);
                        if ((auVar66._14_2_ >> 8 & 1) != 0) {
                          pcVar4[uVar12 + 0xf] = cVar20 + -0x79;
                        }
                        uVar12 = uVar12 + 0x10;
                        lVar5 = auVar23._8_8_;
                        auVar23._0_8_ = auVar23._0_8_ + 0x10;
                        auVar23._8_8_ = lVar5 + 0x10;
                        lVar5 = auVar41._8_8_;
                        auVar41._0_8_ = auVar41._0_8_ + 0x10;
                        auVar41._8_8_ = lVar5 + 0x10;
                        lVar5 = auVar44._8_8_;
                        auVar44._0_8_ = auVar44._0_8_ + 0x10;
                        auVar44._8_8_ = lVar5 + 0x10;
                        lVar5 = auVar47._8_8_;
                        auVar47._0_8_ = auVar47._0_8_ + 0x10;
                        auVar47._8_8_ = lVar5 + 0x10;
                        lVar5 = auVar51._8_8_;
                        auVar51._0_8_ = auVar51._0_8_ + 0x10;
                        auVar51._8_8_ = lVar5 + 0x10;
                        lVar5 = auVar55._8_8_;
                        auVar55._0_8_ = auVar55._0_8_ + 0x10;
                        auVar55._8_8_ = lVar5 + 0x10;
                        lVar5 = auVar59._8_8_;
                        auVar59._0_8_ = auVar59._0_8_ + 0x10;
                        auVar59._8_8_ = lVar5 + 0x10;
                        lVar5 = auVar63._8_8_;
                        auVar63._0_8_ = auVar63._0_8_ + 0x10;
                        auVar63._8_8_ = lVar5 + 0x10;
                      } while ((uVar7 + 0xf & 0xfffffff0) != uVar12);
                      if (*pcVar4 == 'x') {
                        uVar12 = 1;
                        do {
                          uVar8 = uVar12;
                          if (uVar6 == uVar8) break;
                          uVar12 = uVar8 + 1;
                        } while ((char)((char)(uVar8 + 1) + 'w') == pcVar4[uVar8]);
                        if (uVar6 <= uVar8) goto LAB_0010a500;
                      }
                      pcVar4 = "Check failed: Valid(p, alloc_needed, \'x\')\n";
                      uVar10 = 0x2a;
                      goto LAB_0010a7bf;
                    }
LAB_0010a500:
                    free(pcVar4);
                    if ((int)uVar13 < 100) {
                      uVar13 = uVar13 + 1;
                    }
                    else {
                      if (0xfffff < uVar13) {
                        return;
                      }
                      iVar152 = 1;
                      do {
                        iVar153 = iVar152;
                        iVar152 = iVar153 * 2;
                      } while (iVar153 < (int)uVar13);
                      uVar7 = iVar153 - 1;
                      bVar15 = uVar7 != uVar13;
                      bVar14 = (int)uVar7 <= (int)uVar13;
                      uVar13 = uVar7;
                      if (bVar14) {
                        uVar13 = iVar153 + (uint)bVar15;
                      }
                    }
                    if (uVar13 == 0xffffffff) {
                      return;
                    }
                  }
                  testing::Message::Message((Message *)&local_38);
                  if (local_48 ==
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    pcVar4 = "";
                  }
                  else {
                    pcVar4 = (local_48->_M_dataplus)._M_p;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&local_40,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/memalign_unittest.cc"
                             ,0xcd,pcVar4);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&local_40,(Message *)&local_38);
                  goto LAB_0010a780;
                }
                pcVar4 = "Check failed: posix_memalign(&ptr, 4097, 1) == EINVAL\n";
                uVar10 = 0x36;
                goto LAB_0010a7bf;
              }
              pcVar4 = "Check failed: posix_memalign(&ptr, sizeof(void*)+1, 1) == EINVAL\n";
            }
            else {
              pcVar4 = "Check failed: posix_memalign(&ptr, sizeof(void*)/2, 1) == EINVAL\n";
            }
            uVar10 = 0x41;
          }
          else {
            pcVar4 = "Check failed: posix_memalign(&ptr, 0, 1) == EINVAL\n";
            uVar10 = 0x33;
          }
          goto LAB_0010a7bf;
        }
      }
      pcVar4 = "Check failed: Valid(p3, 1<<19, \'c\')\n";
    }
    else {
LAB_0010a812:
      pcVar4 = "Check failed: Valid(p2, 1<<19, \'b\')\n";
    }
  }
  else {
LAB_0010a809:
    pcVar4 = "Check failed: Valid(p1, 1<<19, \'a\')\n";
  }
  uVar10 = 0x24;
LAB_0010a7bf:
  syscall(1,2,pcVar4,uVar10);
  abort();
}

Assistant:

TEST(MemalignTest, Basic) {
  // Try allocating data with a bunch of alignments and sizes
  for (int a = 1; a < 1048576; a *= 2) {
    for (int s = 0; s != -1; s = NextSize(s)) {
      void* ptr = memalign(a, s);
      ASSERT_EQ(Misallignment(ptr, a), 0);
      Fill(ptr, s, 'x');
      CHECK(Valid(ptr, s, 'x'));
      free(ptr);

      if ((a >= sizeof(void*)) && ((a & (a-1)) == 0)) {
        CHECK(posix_memalign(&ptr, a, s) == 0);
        ASSERT_EQ(Misallignment(ptr, a), 0);
        Fill(ptr, s, 'y');
        CHECK(Valid(ptr, s, 'y'));
        free(ptr);
      }
    }
  }

  {
    // Check various corner cases
    void* p1 = memalign(1<<20, 1<<19);
    void* p2 = memalign(1<<19, 1<<19);
    void* p3 = memalign(1<<21, 1<<19);
    ASSERT_EQ(Misallignment(p1, 1<<20), 0);
    ASSERT_EQ(Misallignment(p2, 1<<19), 0);
    ASSERT_EQ(Misallignment(p3, 1<<21), 0);
    Fill(p1, 1<<19, 'a');
    Fill(p2, 1<<19, 'b');
    Fill(p3, 1<<19, 'c');
    CHECK(Valid(p1, 1<<19, 'a'));
    CHECK(Valid(p2, 1<<19, 'b'));
    CHECK(Valid(p3, 1<<19, 'c'));
    free(p1);
    free(p2);
    free(p3);
  }

  {
    // posix_memalign
    void* ptr;
    CHECK(posix_memalign(&ptr, 0, 1) == EINVAL);
    CHECK(posix_memalign(&ptr, sizeof(void*)/2, 1) == EINVAL);
    CHECK(posix_memalign(&ptr, sizeof(void*)+1, 1) == EINVAL);
    CHECK(posix_memalign(&ptr, 4097, 1) == EINVAL);

    // Grab some memory so that the big allocation below will definitely fail.
    void* p_small = noopt(malloc)(4*1048576);
    CHECK_NE(p_small, nullptr);

    // Make sure overflow is returned as ENOMEM
    const size_t zero = 0;
    constexpr size_t kMinusNTimes = 10;
    for ( size_t i = 1; i < kMinusNTimes; ++i ) {
      int r = posix_memalign(&ptr, 1024, zero - i);
      CHECK(r == ENOMEM);
    }

    free(p_small);
  }

  const int pagesize = getpagesize();
  {
    // valloc
    for (int s = 0; s != -1; s = NextSize(s)) {
      void* p = valloc(s);
      ASSERT_EQ(Misallignment(p, pagesize), 0);
      Fill(p, s, 'v');
      CHECK(Valid(p, s, 'v'));
      free(p);
    }
  }

  {
    // pvalloc
    for (int s = 0; s != -1; s = NextSize(s)) {
      void* p = pvalloc(s);
      ASSERT_EQ(Misallignment(p, pagesize), 0);
      int alloc_needed = ((s + pagesize - 1) / pagesize) * pagesize;
      Fill(p, alloc_needed, 'x');
      CHECK(Valid(p, alloc_needed, 'x'));
      free(p);
    }
  }
}